

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O0

void test_clear(CuTest *tc)

{
  critbit_tree cVar1;
  int iVar2;
  void *pvVar3;
  char *actual;
  critbit_tree local_18;
  critbit_tree cb;
  CuTest *tc_local;
  
  cb.root = tc;
  memset(&local_18,0,8);
  cVar1.root = cb.root;
  iVar2 = cb_insert(&local_18,"herp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cVar1.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x123,(char *)0x0,0,iVar2);
  cVar1 = cb;
  pvVar3 = cb_find(&local_18,"herp",5);
  CuAssert_Line((CuTest *)cVar1.root,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c"
                ,0x124,"null pointer unexpected",(uint)(pvVar3 != (void *)0x0));
  cb_clear(&local_18);
  cVar1 = cb;
  actual = (char *)cb_find(&local_18,"herp",5);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cVar1.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x126,(char *)0x0,(char *)0x0,actual);
  cVar1 = cb;
  iVar2 = cb_insert(&local_18,"herp",5);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cVar1.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x127,(char *)0x0,0,iVar2);
  cVar1 = cb;
  pvVar3 = cb_find(&local_18,"herp",5);
  CuAssert_Line((CuTest *)cVar1.root,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c"
                ,0x128,"null pointer unexpected",(uint)(pvVar3 != (void *)0x0));
  return;
}

Assistant:

static void test_clear(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();

  CuAssertIntEquals(tc, CB_SUCCESS, cb_insert_str(&cb, "herp"));
  CuAssertPtrNotNull(tc, cb_find_str(&cb, "herp"));
  cb_clear(&cb);
  CuAssertStrEquals(tc, NULL, cb_find_str(&cb, "herp"));
  CuAssertIntEquals(tc, CB_SUCCESS, cb_insert_str(&cb, "herp"));
  CuAssertPtrNotNull(tc, cb_find_str(&cb, "herp"));
}